

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * Curl_checkProxyheaders(connectdata *conn,char *thisheader)

{
  SessionHandle *pSVar1;
  int iVar2;
  size_t max;
  curl_slist *local_40;
  SessionHandle *data;
  size_t thislen;
  curl_slist *head;
  char *thisheader_local;
  connectdata *conn_local;
  
  max = strlen(thisheader);
  pSVar1 = conn->data;
  if ((((conn->bits).proxy & 1U) == 0) || (((pSVar1->set).sep_headers & 1U) == 0)) {
    local_40 = (pSVar1->set).headers;
  }
  else {
    local_40 = (pSVar1->set).proxyheaders;
  }
  thislen = (size_t)local_40;
  while( true ) {
    if (thislen == 0) {
      return (char *)0x0;
    }
    iVar2 = Curl_raw_nequal(*(char **)thislen,thisheader,max);
    if (iVar2 != 0) break;
    thislen = *(size_t *)(thislen + 8);
  }
  return *(char **)thislen;
}

Assistant:

char *Curl_checkProxyheaders(const struct connectdata *conn,
                             const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct SessionHandle *data = conn->data;

  for(head = (conn->bits.proxy && data->set.sep_headers)?
        data->set.proxyheaders:data->set.headers;
      head; head=head->next) {
    if(Curl_raw_nequal(head->data, thisheader, thislen))
      return head->data;
  }
  return NULL;
}